

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwGetMonitorPhysicalSize(GLFWmonitor *handle,int *width,int *height)

{
  _GLFWmonitor *monitor;
  int *height_local;
  int *width_local;
  GLFWmonitor *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    if (width != (int *)0x0) {
      *width = *(int *)(handle + 8);
    }
    if (height != (int *)0x0) {
      *height = *(int *)(handle + 0xc);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorPhysicalSize(GLFWmonitor* handle, int* width, int* height)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;

    _GLFW_REQUIRE_INIT();

    if (width)
        *width = monitor->widthMM;
    if (height)
        *height = monitor->heightMM;
}